

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

int Abc_NodeStrashToGia(Gia_Man_t *pNew,Abc_Obj_t *pNode)

{
  int *piVar1;
  Abc_Ntk_t *pAVar2;
  Hop_Man_t *p;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar3;
  int iVar4;
  uint uVar5;
  Hop_Obj_t *pHVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  char *__assertion;
  Hop_Obj_t *pObj;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    pAVar2 = pNode->pNtk;
    if ((pAVar2->ntkFunc == ABC_FUNC_AIG) && (pAVar2->ntkType != ABC_NTK_STRASH)) {
      p = (Hop_Man_t *)pAVar2->pManFunc;
      aVar3 = pNode->field_5;
      iVar4 = Abc_NodeIsConst(pNode);
      uVar9 = aVar3.iData;
      if ((iVar4 != 0) ||
         (pObj = (Hop_Obj_t *)((ulong)aVar3.pData & 0xfffffffffffffffe), p->pConst1 == pObj)) {
        return ~uVar9 & 1;
      }
      uVar5 = (pNode->vFanins).nSize;
      uVar7 = 0;
      uVar8 = 0;
      if (0 < (int)uVar5) {
        uVar8 = (ulong)uVar5;
      }
      do {
        if (uVar8 == uVar7) {
          for (lVar10 = 0; lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
            iVar4 = *(int *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar10]] +
                            0x40);
            pHVar6 = Hop_IthVar(p,(int)lVar10);
            (pHVar6->field_0).iData = iVar4;
            uVar5 = (pNode->vFanins).nSize;
          }
          Abc_NodeStrashToGia_rec(pNew,pObj);
          Hop_ConeUnmark_rec(pObj);
          iVar4 = Abc_LitNotCond((pObj->field_0).iData,uVar9 & 1);
          return iVar4;
        }
        piVar1 = (pNode->vFanins).pArray + uVar7;
        uVar7 = uVar7 + 1;
      } while (*(int *)((long)pNode->pNtk->vObjs->pArray[*piVar1] + 0x40) != -1);
      __assertion = "pFanin->iTemp != -1";
      uVar9 = 0x44;
    }
    else {
      __assertion = "Abc_NtkHasAig(pNode->pNtk) && !Abc_NtkIsStrash(pNode->pNtk)";
      uVar9 = 0x3e;
    }
  }
  else {
    __assertion = "Abc_ObjIsNode(pNode)";
    uVar9 = 0x3d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,uVar9,"int Abc_NodeStrashToGia(Gia_Man_t *, Abc_Obj_t *)");
}

Assistant:

int Abc_NodeStrashToGia( Gia_Man_t * pNew, Abc_Obj_t * pNode )
{
    Hop_Man_t * pMan = (Hop_Man_t *)pNode->pNtk->pManFunc;
    Hop_Obj_t * pRoot = (Hop_Obj_t *)pNode->pData;
    Abc_Obj_t * pFanin;  int i;
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_NtkHasAig(pNode->pNtk) && !Abc_NtkIsStrash(pNode->pNtk) );
    // check the constant case
    if ( Abc_NodeIsConst(pNode) || Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return Abc_LitNotCond( 1, Hop_IsComplement(pRoot) );
    // set elementary variables
    Abc_ObjForEachFanin( pNode, pFanin, i )
        assert( pFanin->iTemp != -1 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Hop_IthVar(pMan, i)->iData = pFanin->iTemp;
    // strash the AIG of this node
    Abc_NodeStrashToGia_rec( pNew, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Abc_LitNotCond( Hop_Regular(pRoot)->iData, Hop_IsComplement(pRoot) );
}